

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::reallocate
          (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this,size_t size)

{
  Name *pNVar1;
  ulong local_28;
  size_t i;
  Name *old;
  size_t size_local;
  ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this_local;
  
  pNVar1 = this->data;
  ArenaVector<wasm::Name>::allocate((ArenaVector<wasm::Name> *)this,size);
  for (local_28 = 0; local_28 < this->usedElements; local_28 = local_28 + 1) {
    wasm::Name::operator=(this->data + local_28,pNVar1 + local_28);
  }
  return;
}

Assistant:

void reallocate(size_t size) {
    T* old = data;
    static_cast<SubType*>(this)->allocate(size);
    for (size_t i = 0; i < usedElements; i++) {
      data[i] = old[i];
    }
  }